

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::destroyItemGroup(QGraphicsScene *this,QGraphicsItemGroup *group)

{
  QGraphicsItem **ppQVar1;
  QList<QGraphicsItem_*> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsItem::childItems((QList<QGraphicsItem_*> *)&local_48,&group->super_QGraphicsItem);
  ppQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    QGraphicsItemGroup::removeFromGroup(group,*(QGraphicsItem **)((long)ppQVar1 + lVar2));
  }
  removeItem(this,&group->super_QGraphicsItem);
  (*(group->super_QGraphicsItem)._vptr_QGraphicsItem[1])(group);
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::destroyItemGroup(QGraphicsItemGroup *group)
{
    const auto items = group->childItems();
    for (QGraphicsItem *item : items)
        group->removeFromGroup(item);
    removeItem(group);
    delete group;
}